

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMoveToSr<(moira::Instr)75,(moira::Mode)9,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  bool error;
  bool local_19;
  
  if ((this->reg).sr.s != false) {
    uVar1 = computeEA<(moira::Mode)9,(moira::Size)2,0ul>(this,opcode & 7);
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,128ul>(this,uVar1,&local_19);
    if (local_19 == false) {
      (*this->_vptr_Moira[0x19])(this,4);
      setSR(this,(u16)uVar1);
      readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
      uVar1 = (this->reg).pc;
      (this->reg).pc0 = uVar1;
      (this->queue).ird = (this->queue).irc;
      uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
      (this->queue).irc = (u16)uVar1;
    }
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execMoveToSr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int src = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;

    sync(4);
    setSR(data);

    (void)readM <MEM_PROG, Word> (reg.pc + 2);
    prefetch<POLLIPL>();
}